

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O0

Mode anon_unknown.dwarf_205d4::adios2_ToMode(adios2_mode mode,string *hint)

{
  invalid_argument *this;
  char *__rhs;
  int in_EDI;
  Mode modeCpp;
  undefined3 in_stack_ffffffffffffff98;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff9c;
  string local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  Mode local_14;
  
  __rhs = (char *)(ulong)(in_EDI - 1);
  switch(__rhs) {
  case (char *)0x0:
    local_14 = Write;
    break;
  case (char *)0x1:
    local_14 = Read;
    break;
  case (char *)0x2:
    local_14 = Append;
    break;
  case (char *)0x3:
    local_14 = Deferred;
    break;
  case (char *)0x4:
    local_14 = Sync;
    break;
  case (char *)0x5:
    local_14 = ReadRandomAccess;
    break;
  default:
    uVar1 = CONCAT13(1,in_stack_ffffffffffffff98);
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff9c,uVar1),__rhs);
    std::invalid_argument::invalid_argument(this,local_38);
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return local_14;
}

Assistant:

adios2::Mode adios2_ToMode(const adios2_mode mode, const std::string &hint)
{
    adios2::Mode modeCpp = adios2::Mode::Undefined;
    switch (mode)
    {
    case adios2_mode_write:
        modeCpp = adios2::Mode::Write;
        break;
    case adios2_mode_read:
        modeCpp = adios2::Mode::Read;
        break;
    case adios2_mode_append:
        modeCpp = adios2::Mode::Append;
        break;
    case adios2_mode_readRandomAccess:
        modeCpp = adios2::Mode::ReadRandomAccess;
        break;
    case adios2_mode_deferred:
        modeCpp = adios2::Mode::Deferred;
        break;
    case adios2_mode_sync:
        modeCpp = adios2::Mode::Sync;
        break;
    default:
        throw std::invalid_argument("ERROR: invalid adios2_mode, " + hint + "\n");
    }
    return modeCpp;
}